

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

Leaf * __thiscall
kj::_::BTreeImpl::eraseHelper<kj::_::BTreeImpl::Leaf>
          (BTreeImpl *this,Leaf *node,Parent *parent,uint indexInParent,uint pos,MaybeUint **fixup)

{
  MaybeUint *pMVar1;
  Leaf *pLVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  NodeUnion *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  anon_union_64_3_a03489b4_for_NodeUnion_0 *paVar14;
  ulong uVar15;
  uint *puVar16;
  int iVar17;
  uint uVar18;
  NodeUnion *pNVar19;
  Fault f;
  Fault local_38;
  
  if (parent == (Parent *)0x0) {
    return node;
  }
  if (node->rows[7].i != 0) {
    return node;
  }
  if (indexInParent == 0) {
    if (parent->keys[0].i == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x236,FAILED,(char *)0x0,"\"inconsistent b-tree\"",
                 (char (*) [20])"inconsistent b-tree");
      Debug::Fault::fatal(&local_38);
    }
    pMVar1 = parent->keys;
    uVar18 = parent->children[1];
    pNVar6 = this->tree;
    puVar16 = pNVar6[uVar18].field_0.freelist.zero + 1;
    pNVar19 = pNVar6 + uVar18;
    if (pNVar6[uVar18].field_0.freelist.zero[8] != 0) {
      uVar4 = *puVar16;
      node->rows[7].i = uVar4;
      pMVar1->i = uVar4;
      if (*fixup == pMVar1) {
        *fixup = (MaybeUint *)0x0;
      }
      uVar7 = *(undefined8 *)((long)&pNVar19->field_0 + 0xc);
      uVar8 = *(undefined8 *)((long)&pNVar19->field_0 + 0x14);
      uVar9 = *(undefined8 *)((long)&pNVar19->field_0 + 0x1c);
      uVar10 = *(undefined8 *)((long)&pNVar19->field_0 + 0x24);
      uVar11 = *(undefined8 *)((long)&pNVar19->field_0 + 0x2c);
      uVar12 = *(undefined8 *)((long)&pNVar19->field_0 + 0x34);
      pNVar6[uVar18].field_0.freelist.zero[0xd] = (pNVar19->field_0).freelist.zero[0xe];
      *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x28) = uVar11;
      *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x30) = uVar12;
      *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x18) = uVar9;
      *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x20) = uVar10;
      *(undefined8 *)puVar16 = uVar7;
      *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x10) = uVar8;
      (pNVar19->field_0).freelist.zero[0xe] = 0;
      return node;
    }
    uVar7 = *(undefined8 *)puVar16;
    uVar8 = *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x10);
    uVar9 = *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x1c);
    *(undefined8 *)(node->rows + 10) = *(undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x14);
    *(undefined8 *)(node->rows + 0xc) = uVar9;
    *(undefined8 *)(node->rows + 7) = uVar7;
    *(undefined8 *)(node->rows + 9) = uVar8;
    uVar5 = (pNVar19->field_0).leaf.next;
    node->next = uVar5;
    puVar16 = this->tree[uVar5].field_0.freelist.zero;
    if ((ulong)uVar5 == 0) {
      puVar16 = &this->endLeaf;
    }
    *puVar16 = pos;
    uVar7 = *(undefined8 *)(parent->keys + 3);
    *(undefined8 *)(parent->keys + 4) = *(undefined8 *)(parent->keys + 5);
    *(undefined8 *)pMVar1 = *(undefined8 *)(parent->keys + 1);
    *(undefined8 *)(parent->keys + 2) = uVar7;
    parent->keys[6].i = 0;
    *(undefined8 *)(parent->children + 5) = *(undefined8 *)(parent->children + 6);
    *(undefined8 *)(parent->children + 1) = *(undefined8 *)(parent->children + 2);
    *(undefined8 *)(parent->children + 3) = *(undefined8 *)(parent->children + 4);
    parent->children[7] = 0;
    pNVar6 = this->tree;
    pNVar6[uVar18].field_0.freelist.nextOffset = ~uVar18 + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = uVar18;
    this->freelistSize = this->freelistSize + 1;
    if (*fixup == pMVar1) {
      *fixup = (MaybeUint *)0x0;
    }
    if (pMVar1->i != 0) {
      return node;
    }
    pNVar6 = this->tree;
    uVar7 = *(undefined8 *)node;
    uVar8 = *(undefined8 *)node->rows;
    uVar9 = *(undefined8 *)(node->rows + 2);
    uVar10 = *(undefined8 *)(node->rows + 4);
    uVar11 = *(undefined8 *)(node->rows + 6);
    uVar12 = *(undefined8 *)(node->rows + 8);
    uVar13 = *(undefined8 *)(node->rows + 0xc);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x30) = *(undefined8 *)(node->rows + 10);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x38) = uVar13;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x20) = uVar11;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x28) = uVar12;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x10) = uVar9;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x18) = uVar10;
    *(undefined8 *)&pNVar6->field_0 = uVar7;
    *(undefined8 *)((long)&pNVar6->field_0 + 8) = uVar8;
    puVar16 = this->tree[node->next].field_0.freelist.zero;
    if ((ulong)node->next == 0) {
      puVar16 = &this->endLeaf;
    }
    *puVar16 = 0;
    if ((ulong)node->prev == 0) {
      this->beginLeaf = 0;
    }
    else {
      this->tree[node->prev].field_0.freelist.nextOffset = 0;
    }
    pNVar6 = this->tree;
    pNVar6[pos].field_0.freelist.nextOffset = ~pos + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = pos;
  }
  else {
    uVar15 = (ulong)(indexInParent - 1);
    uVar18 = parent->children[uVar15];
    pNVar6 = this->tree;
    pLVar2 = (Leaf *)(pNVar6 + uVar18);
    if (pNVar6[uVar18].field_0.freelist.zero[8] != 0) {
      *(undefined8 *)(node->rows + 1) = *(undefined8 *)node->rows;
      *(undefined8 *)(node->rows + 3) = *(undefined8 *)(node->rows + 2);
      uVar4 = node->rows[6].i;
      *(undefined8 *)(node->rows + 5) = *(undefined8 *)(node->rows + 4);
      node->rows[7].i = uVar4;
      iVar17 = 7;
      if (pLVar2->rows[6].i == 0) {
        iVar17 = 0;
      }
      iVar17 = iVar17 + (uint)(*(int *)((long)&pLVar2->rows[3].i + (ulong)(uint)(iVar17 * 4)) != 0)
                        * 4;
      uVar18 = iVar17 + (uint)(*(int *)((long)&pLVar2->rows[1].i + (ulong)(uint)(iVar17 * 4)) != 0)
                        * 2;
      iVar17 = (uVar18 + 1) - (uint)(pLVar2->rows[uVar18].i == 0);
      uVar18 = iVar17 - 1;
      node->rows[0].i = pLVar2->rows[uVar18].i;
      parent->keys[uVar15].i = pLVar2->rows[iVar17 - 2].i;
      pLVar2->rows[uVar18].i = 0;
      return node;
    }
    paVar14 = &pNVar6[uVar18].field_0;
    uVar7 = *(undefined8 *)node->rows;
    uVar8 = *(undefined8 *)(node->rows + 2);
    uVar9 = *(undefined8 *)(node->rows + 5);
    *(undefined8 *)((long)paVar14 + 0x30) = *(undefined8 *)(node->rows + 3);
    *(undefined8 *)((long)paVar14 + 0x38) = uVar9;
    *(undefined8 *)((long)paVar14 + 0x24) = uVar7;
    ((undefined8 *)((long)paVar14 + 0x24))[1] = uVar8;
    uVar5 = node->next;
    pLVar2->next = uVar5;
    puVar16 = this->tree[uVar5].field_0.freelist.zero;
    if ((ulong)uVar5 == 0) {
      puVar16 = &this->endLeaf;
    }
    *puVar16 = uVar18;
    memmove(parent->keys + uVar15,parent->keys + uVar15 + 1,(ulong)indexInParent * -4 + 0x1c);
    parent->keys[6].i = 0;
    memmove(parent->children + uVar15 + 1,parent->children + uVar15 + 2,
            (ulong)(indexInParent + 1) * -4 + 0x20);
    parent->children[7] = 0;
    pNVar6 = this->tree;
    pNVar6[pos].field_0.freelist.nextOffset = ~pos + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[pos].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = pos;
    this->freelistSize = this->freelistSize + 1;
    if (*fixup == parent->keys + indexInParent) {
      *fixup = *fixup + -1;
    }
    if (parent->keys[0].i != 0) {
      return pLVar2;
    }
    pNVar6 = this->tree;
    uVar7 = *(undefined8 *)pLVar2;
    uVar8 = *(undefined8 *)pLVar2->rows;
    uVar9 = *(undefined8 *)(pLVar2->rows + 2);
    uVar10 = *(undefined8 *)(pLVar2->rows + 4);
    uVar11 = *(undefined8 *)(pLVar2->rows + 6);
    uVar12 = *(undefined8 *)(pLVar2->rows + 8);
    uVar13 = *(undefined8 *)(pLVar2->rows + 0xc);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x30) = *(undefined8 *)(pLVar2->rows + 10);
    *(undefined8 *)((long)&pNVar6->field_0 + 0x38) = uVar13;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x20) = uVar11;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x28) = uVar12;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x10) = uVar9;
    *(undefined8 *)((long)&pNVar6->field_0 + 0x18) = uVar10;
    *(undefined8 *)&pNVar6->field_0 = uVar7;
    *(undefined8 *)((long)&pNVar6->field_0 + 8) = uVar8;
    puVar16 = this->tree[pLVar2->next].field_0.freelist.zero;
    if ((ulong)pLVar2->next == 0) {
      puVar16 = &this->endLeaf;
    }
    *puVar16 = 0;
    if ((ulong)pLVar2->prev == 0) {
      this->beginLeaf = 0;
    }
    else {
      this->tree[pLVar2->prev].field_0.freelist.nextOffset = 0;
    }
    pNVar6 = this->tree;
    pNVar6[uVar18].field_0.freelist.nextOffset = ~uVar18 + this->freelistHead;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 4);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x14);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x24);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)&pNVar6[uVar18].field_0 + 0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    this->freelistHead = uVar18;
  }
  this->freelistSize = this->freelistSize + 1;
  this->height = this->height - 1;
  return (Leaf *)this->tree;
}

Assistant:

Node& BTreeImpl::eraseHelper(
    Node& node, Parent* parent, uint indexInParent, uint pos, MaybeUint*& fixup) {
  if (parent != nullptr && !node.isMostlyFull()) {
    // This is not the root, but it's only half-full. Rebalance.
    KJ_DASSERT(node.isHalfFull());

    if (indexInParent > 0) {
      // There's a sibling to the left.
      uint sibPos = parent->children[indexInParent - 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Left sibling is more than half full. Steal one member.
        rotateRight(sib, node, *parent, indexInParent - 1);
        return node;
      } else {
        // Left sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(sib, sibPos, *parent->keys[indexInParent - 1], node);
        parent->eraseAfter(indexInParent - 1);
        free(pos);
        if (fixup == &parent->keys[indexInParent]) --fixup;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, sib);
          free(sibPos);
          --height;
          return tree[0];
        } else {
          return sib;
        }
      }
    } else if (indexInParent < Parent::NKEYS && parent->keys[indexInParent] != nullptr) {
      // There's a sibling to the right.
      uint sibPos = parent->children[indexInParent + 1];
      Node& sib = tree[sibPos];
      if (sib.isMostlyFull()) {
        // Right sibling is more than half full. Steal one member.
        rotateLeft(node, sib, *parent, indexInParent, fixup);
        return node;
      } else {
        // Right sibling is half full, too. Merge.
        KJ_ASSERT(sib.isHalfFull());
        merge(node, pos, *parent->keys[indexInParent], sib);
        parent->eraseAfter(indexInParent);
        free(sibPos);
        if (fixup == &parent->keys[indexInParent]) fixup = nullptr;

        if (parent->keys[0] == nullptr) {
          // Oh hah, the parent has no keys left. It must be the root. We can eliminate it.
          KJ_DASSERT(parent == &tree->parent);
          compilerBarrier();  // don't reorder any writes to parent below here
          move(tree[0], 0, node);
          free(pos);
          --height;
          return tree[0];
        } else {
          return node;
        }
      }
    } else {
      KJ_FAIL_ASSERT("inconsistent b-tree");
    }
  }

  return node;
}